

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::OutOfRangeException::OutOfRangeException<unsigned_long,std::__cxx11::string>
          (OutOfRangeException *this,string *msg,unsigned_long params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string local_60;
  string local_40 [32];
  
  ::std::__cxx11::string::string(local_40,(string *)params_1);
  Exception::ConstructMessage<unsigned_long,std::__cxx11::string>
            (&local_60,(Exception *)msg,(string *)params,(unsigned_long)local_40,in_R8);
  OutOfRangeException(this,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

explicit OutOfRangeException(const string &msg, ARGS... params)
	    : OutOfRangeException(ConstructMessage(msg, params...)) {
	}